

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.hpp
# Opt level: O2

key_view __thiscall
unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::get_key
          (iterator *this)

{
  undefined4 *puVar1;
  _Elt_pointer piVar2;
  key_view kVar3;
  
  piVar2 = (this->stack_).c.
           super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (piVar2 == (this->stack_).c.
                super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    __assert_fail("valid()",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art.hpp"
                  ,0x53b,
                  "key_view unodb::db<unsigned long, std::span<const std::byte>>::iterator::get_key() [Key = unsigned long, Value = std::span<const std::byte>]"
                 );
  }
  if (piVar2 == (this->stack_).c.
                super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    piVar2 = (this->stack_).c.
             super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
  }
  puVar1 = (undefined4 *)piVar2[-1].node.tagged_ptr;
  if (((ulong)puVar1 & 7) == 0) {
    kVar3._M_ptr = puVar1 + 2;
    kVar3._M_extent._M_extent_value._0_4_ = *puVar1;
    kVar3._M_extent._M_extent_value._4_4_ = 0;
    return kVar3;
  }
  __assert_fail("node.type() == node_type::LEAF",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art.hpp"
                ,0x544,
                "key_view unodb::db<unsigned long, std::span<const std::byte>>::iterator::get_key() [Key = unsigned long, Value = std::span<const std::byte>]"
               );
}

Assistant:

key_view db<Key, Value>::iterator::get_key() noexcept {
  UNODB_DETAIL_ASSERT(valid());  // by contract
  // TODO(thompsonbry) : variable length keys. The simplest case
  // where this does not work today is a single root leaf.  In that
  // case, there is no inode path and we can not properly track the
  // key in the key_buffer.
  //
  // return keybuf_.get_key_view();
  const auto& e = stack_.top();
  const auto& node = e.node;
  UNODB_DETAIL_ASSERT(node.type() == node_type::LEAF);      // On a leaf.
  const auto* const leaf{node.template ptr<leaf_type*>()};  // current leaf.
  return leaf->get_key_view();
}